

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O3

void __thiscall Error::Private::Framework::Framework(Framework *this)

{
  code *pcVar1;
  int iVar2;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_c;
  
  pthread_mutexattr_init(&local_c);
  iVar2 = pthread_mutex_init((pthread_mutex_t *)&mutex,&local_c);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Error.cpp"
                          ,0x47,"pthread_mutex_init(&mutex, &attr) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

Framework()
    {
#ifdef _WIN32
      InitializeCriticalSection(&cs);
#else
      pthread_mutexattr_t attr; // TODO: use global var for this?
      pthread_mutexattr_init(&attr);
      VERIFY(pthread_mutex_init(&mutex, &attr) == 0);
#endif
    }